

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O2

int Saig_ManDemiterNew(Aig_Man_t *pMan)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Vec_Ptr_t *pVVar5;
  void *pvVar6;
  Aig_Obj_t *pAVar7;
  char *pcVar8;
  uint i;
  Aig_Obj_t *pFan1;
  Aig_Obj_t *pFan0;
  Vec_Ptr_t *local_38;
  
  pVVar5 = Vec_PtrAlloc(100);
  for (i = 0; (int)i < pMan->nTruePos; i = i + 1) {
    pvVar6 = Vec_PtrEntry(pMan->vCos,i);
    if ((pMan->nConstrs != 0) && (pMan->nTruePos - pMan->nConstrs <= (int)i)) break;
    printf("Output %3d : ",(ulong)i);
    iVar2 = Aig_ObjIsConst1((Aig_Obj_t *)(*(ulong *)((long)pvVar6 + 8) & 0xfffffffffffffffe));
    uVar1 = *(ulong *)((long)pvVar6 + 8);
    if (iVar2 == 0) {
      if ((*(uint *)&((Aig_Obj_t *)(uVar1 & 0xfffffffffffffffe))->field_0x18 & 7) - 7 < 0xfffffffe)
      {
        pcVar8 = "Terminal";
        goto LAB_00595575;
      }
      if ((uVar1 & 1) == 0) {
        printf("AND  ");
        iVar2 = Aig_ObjRecognizeExor
                          ((Aig_Obj_t *)(*(ulong *)((long)pvVar6 + 8) & 0xfffffffffffffffe),&pFan0,
                           &pFan1);
        pcVar8 = " Yes";
        if (iVar2 == 0) {
          pcVar8 = " No";
        }
        printf(pcVar8);
LAB_00595673:
        putchar(10);
      }
      else {
        Aig_ObjCollectSuper((Aig_Obj_t *)(uVar1 & 0xfffffffffffffffe),pVVar5);
        printf("OR with %d inputs    ",(ulong)(uint)pVVar5->nSize);
        if (pVVar5->nSize != 2) goto LAB_00595673;
        iVar2 = Aig_ObjRecognizeExor
                          ((Aig_Obj_t *)(*(ulong *)((long)pvVar6 + 8) & 0xfffffffffffffffe),&pFan0,
                           &pFan1);
        if (iVar2 == 0) {
          printf(" No");
        }
        else {
          local_38 = pVVar5;
          printf(" Yes");
          putchar(10);
          pVVar5 = Aig_Support(pMan,(Aig_Obj_t *)((ulong)pFan0 & 0xfffffffffffffffe));
          for (iVar2 = 0; iVar2 < pVVar5->nSize; iVar2 = iVar2 + 1) {
            pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(pVVar5,iVar2);
            iVar3 = Saig_ObjIsLo(pMan,pAVar7);
            if (iVar3 != 0) {
              uVar4 = Aig_ObjCioId(pAVar7);
              printf(" %d",(ulong)uVar4);
            }
          }
          putchar(10);
          Vec_PtrFree(pVVar5);
          pVVar5 = Aig_Support(pMan,(Aig_Obj_t *)((ulong)pFan1 & 0xfffffffffffffffe));
          for (iVar2 = 0; iVar2 < pVVar5->nSize; iVar2 = iVar2 + 1) {
            pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(pVVar5,iVar2);
            iVar3 = Saig_ObjIsLo(pMan,pAVar7);
            if (iVar3 != 0) {
              uVar4 = Aig_ObjCioId(pAVar7);
              printf(" %d",(ulong)uVar4);
            }
          }
          putchar(10);
          Vec_PtrFree(pVVar5);
          pVVar5 = local_38;
        }
        putchar(10);
      }
    }
    else {
      if ((uVar1 & 1) == 0) {
        pcVar8 = "Const1";
      }
      else {
        pcVar8 = "Const0";
      }
LAB_00595575:
      puts(pcVar8);
    }
  }
  Vec_PtrFree(pVVar5);
  return 1;
}

Assistant:

int Saig_ManDemiterNew( Aig_Man_t * pMan )
{
    Vec_Ptr_t * vSuper, * vSupp0, * vSupp1;
    Aig_Obj_t * pObj, * pTemp, * pFan0, * pFan1;
    int i, k;
    vSuper = Vec_PtrAlloc( 100 );
    Saig_ManForEachPo( pMan, pObj, i )
    {
        if ( pMan->nConstrs && i >= Saig_ManPoNum(pMan) - pMan->nConstrs )
            break;
        printf( "Output %3d : ", i );
        if ( Aig_ObjIsConst1(Aig_ObjFanin0(pObj)) )
        {
            if ( !Aig_ObjFaninC0(pObj) )
                printf( "Const1\n" );
            else
                printf( "Const0\n" );
            continue;
        }
        if ( !Aig_ObjIsNode(Aig_ObjFanin0(pObj)) )
        {
            printf( "Terminal\n" );
            continue;
        }
        // check AND
        if ( !Aig_ObjFaninC0(pObj) )
        { 
            printf( "AND  " );
            if ( Aig_ObjRecognizeExor(Aig_ObjFanin0(pObj), &pFan0, &pFan1) )
                printf( " Yes" );
            else
                printf( " No" );
            printf( "\n" );
            continue;
        }
        // check OR
        Aig_ObjCollectSuper( Aig_ObjFanin0(pObj), vSuper );
        printf( "OR with %d inputs    ", Vec_PtrSize(vSuper) );
        if ( Vec_PtrSize(vSuper) == 2 )
        {
            if ( Aig_ObjRecognizeExor(Aig_ObjFanin0(pObj), &pFan0, &pFan1) )
            {
                printf( " Yes" );
                printf( "\n" );

                vSupp0 = Aig_Support( pMan, Aig_Regular(pFan0) );
                Vec_PtrForEachEntry( Aig_Obj_t *, vSupp0, pTemp, k )
                    if ( Saig_ObjIsLo(pMan, pTemp) )
                        printf( " %d", Aig_ObjCioId(pTemp) );
                printf( "\n" );
                Vec_PtrFree( vSupp0 );

                vSupp1 = Aig_Support( pMan, Aig_Regular(pFan1) );
                Vec_PtrForEachEntry( Aig_Obj_t *, vSupp1, pTemp, k )
                    if ( Saig_ObjIsLo(pMan, pTemp) )
                        printf( " %d", Aig_ObjCioId(pTemp) );
                printf( "\n" );
                Vec_PtrFree( vSupp1 );
            }
            else
                printf( " No" );
            printf( "\n" );
            continue;
        }
/*
        Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pTemp, k )
            if ( Aig_ObjRecognizeExor(Aig_Regular(pTemp), &pFan0, &pFan1) )
            {
                printf( " Yes" );
                if ( Aig_IsComplement(pTemp) )
                    pFan0 = Aig_Not(pFan0);
            }
            else
                printf( " No" );
*/
        printf( "\n" );
    }
    Vec_PtrFree( vSuper );
    return 1;
}